

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_rand_str(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  jx9_value *pObj;
  uint nLen;
  ulong uVar2;
  char zString [1024];
  char local_418 [1024];
  
  if (nArg < 1) {
    nLen = 0x10;
  }
  else {
    pObj = *apArg;
    jx9MemObjToInteger(pObj);
    uVar1 = *(uint *)&pObj->x;
    nLen = 0x10;
    if (0xfffffbff < uVar1 - 0x401) {
      nLen = uVar1;
    }
  }
  SyRandomness(&pCtx->pVm->sPrng,local_418,nLen);
  uVar2 = 0;
  do {
    local_418[uVar2] = "abcdefghijklmnopqrstuvwxyz"[(ulong)(long)local_418[uVar2] % 0x1a];
    uVar2 = uVar2 + 1;
  } while (nLen != uVar2);
  jx9_value_string(pCtx->pRet,local_418,nLen);
  return 0;
}

Assistant:

static int vm_builtin_rand_str(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	char zString[1024];
	int iLen = 0x10;
	if( nArg > 0 ){
		/* Get the desired length */
		iLen = jx9_value_to_int(apArg[0]);
		if( iLen < 1 || iLen > 1024 ){
			/* Default length */
			iLen = 0x10;
		}
	}
	/* Generate the random string */
	jx9VmRandomString(pCtx->pVm, zString, iLen);
	/* Return the generated string */
	jx9_result_string(pCtx, zString, iLen); /* Will make it's own copy */
	return SXRET_OK;
}